

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIncludeGuardCommand.cxx
# Opt level: O1

bool __thiscall
cmIncludeGuardCommand::InitialPass
          (cmIncludeGuardCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *status)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  cmMakefile *pcVar2;
  int iVar3;
  char *pcVar4;
  cmState *pcVar5;
  cmake *this_00;
  bool bVar6;
  cmStateDirectory stateDir;
  string includeGuardVar;
  cmStateSnapshot dirSnapshot;
  allocator local_c1;
  undefined1 local_c0 [40];
  string local_98;
  string local_78;
  string local_50;
  
  __rhs = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (0x20 < (ulong)((long)pbVar1 - (long)__rhs)) {
    local_c0._0_8_ = local_c0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_c0,
               "given an invalid number of arguments. The command takes at most 1 argument.","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_c0);
    if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
      operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
    }
    return false;
  }
  if (__rhs == pbVar1) {
    iVar3 = 0;
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)__rhs);
    bVar6 = true;
    if (iVar3 == 0) {
      iVar3 = 1;
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)__rhs);
      if (iVar3 == 0) {
        iVar3 = 2;
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0
                       ,"given an invalid scope: ",__rhs);
        cmCommand::SetError(&this->super_cmCommand,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_c0);
        if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
          operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
        }
        iVar3 = 0;
        bVar6 = false;
      }
    }
    if (!bVar6) {
      return false;
    }
  }
  pcVar2 = (this->super_cmCommand).Makefile;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"CMAKE_CURRENT_LIST_FILE","");
  pcVar4 = cmMakefile::GetDefinition(pcVar2,&local_50);
  std::__cxx11::string::string((string *)&local_78,pcVar4,&local_c1);
  local_98.field_2._M_allocated_capacity._0_7_ = 0x5547434e495f5f;
  local_98.field_2._7_4_ = 0x5f445241;
  local_98._M_string_length = 0xb;
  local_98.field_2._M_local_buf[0xb] = '\0';
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  cmSystemTools::ComputeStringMD5((string *)local_c0,&local_78);
  std::__cxx11::string::_M_append((char *)&local_98,local_c0._0_8_);
  if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
    operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
  }
  std::__cxx11::string::append((char *)&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  pcVar2 = (this->super_cmCommand).Makefile;
  if (iVar3 == 0) {
    bVar6 = cmMakefile::IsDefinitionSet(pcVar2,&local_98);
    if (bVar6) goto LAB_003f0cad;
    cmMakefile::AddDefinition(pcVar2,&local_98,true);
  }
  else if (iVar3 == 1) {
    pcVar4 = cmMakefile::GetProperty(pcVar2,&local_98);
    if (pcVar4 == (char *)0x0) {
      cmMakefile::GetStateSnapshot(pcVar2);
      cmStateSnapshot::GetBuildsystemDirectoryParent
                ((cmStateSnapshot *)&local_78,(cmStateSnapshot *)local_c0);
      pcVar5 = cmStateSnapshot::GetState((cmStateSnapshot *)&local_78);
      bVar6 = pcVar5 != (cmState *)0x0;
      if (bVar6) {
        do {
          cmStateSnapshot::GetDirectory((cmStateDirectory *)local_c0,(cmStateSnapshot *)&local_78);
          pcVar4 = cmStateDirectory::GetProperty((cmStateDirectory *)local_c0,&local_98);
          if (pcVar4 != (char *)0x0) break;
          cmStateSnapshot::GetBuildsystemDirectoryParent
                    ((cmStateSnapshot *)&local_50,(cmStateSnapshot *)&local_78);
          local_78.field_2._M_allocated_capacity = local_50.field_2._M_allocated_capacity;
          local_78._M_dataplus._M_p = local_50._M_dataplus._M_p;
          local_78._M_string_length = local_50._M_string_length;
          pcVar5 = cmStateSnapshot::GetState((cmStateSnapshot *)&local_78);
          bVar6 = pcVar5 != (cmState *)0x0;
        } while (bVar6);
      }
      if (!bVar6) {
        cmMakefile::SetProperty(pcVar2,&local_98,"TRUE");
        goto LAB_003f0d08;
      }
    }
LAB_003f0cad:
    status->ReturnInvoked = true;
  }
  else {
    this_00 = cmMakefile::GetCMakeInstance(pcVar2);
    pcVar4 = cmake::GetProperty(this_00,&local_98);
    bVar6 = pcVar4 != (char *)0x0;
    if (bVar6) {
      status->ReturnInvoked = true;
      goto LAB_003f0d0b;
    }
    cmake::SetProperty(this_00,&local_98,"TRUE");
  }
LAB_003f0d08:
  bVar6 = true;
LAB_003f0d0b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT17(local_98.field_2._M_local_buf[7],
                             local_98.field_2._M_allocated_capacity._0_7_) + 1);
  }
  return bVar6;
}

Assistant:

bool cmIncludeGuardCommand::InitialPass(std::vector<std::string> const& args,
                                        cmExecutionStatus& status)
{
  if (args.size() > 1) {
    this->SetError(
      "given an invalid number of arguments. The command takes at "
      "most 1 argument.");
    return false;
  }

  IncludeGuardScope scope = VARIABLE;

  if (!args.empty()) {
    std::string const& arg = args[0];
    if (arg == "DIRECTORY") {
      scope = DIRECTORY;
    } else if (arg == "GLOBAL") {
      scope = GLOBAL;
    } else {
      this->SetError("given an invalid scope: " + arg);
      return false;
    }
  }

  std::string includeGuardVar = GetIncludeGuardVariableName(
    this->Makefile->GetDefinition("CMAKE_CURRENT_LIST_FILE"));

  cmMakefile* const mf = this->Makefile;

  switch (scope) {
    case VARIABLE:
      if (mf->IsDefinitionSet(includeGuardVar)) {
        status.SetReturnInvoked();
        return true;
      }
      mf->AddDefinition(includeGuardVar, true);
      break;
    case DIRECTORY:
      if (CheckIncludeGuardIsSet(mf, includeGuardVar)) {
        status.SetReturnInvoked();
        return true;
      }
      mf->SetProperty(includeGuardVar, "TRUE");
      break;
    case GLOBAL:
      cmake* const cm = mf->GetCMakeInstance();
      if (cm->GetProperty(includeGuardVar)) {
        status.SetReturnInvoked();
        return true;
      }
      cm->SetProperty(includeGuardVar, "TRUE");
      break;
  }

  return true;
}